

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

bool __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::reserve
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,size_t length)

{
  long lVar1;
  C *pCVar2;
  long *in_RDI;
  size_t oldLength;
  bool in_stack_0000003f;
  size_t in_stack_00000040;
  StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *in_stack_00000048;
  
  lVar1 = in_RDI[2];
  pCVar2 = createBuffer(in_stack_00000048,in_stack_00000040,in_stack_0000003f);
  if (pCVar2 != (C *)0x0) {
    in_RDI[2] = lVar1;
    *(undefined4 *)(*in_RDI + lVar1 * 4) = 0;
  }
  return pCVar2 != (C *)0x0;
}

Assistant:

bool
	reserve(size_t length) {
		size_t oldLength = this->m_length;
		if (!createBuffer(length, true))
			return false;

		ASSERT(this->m_isNullTerminated);
		this->m_length = oldLength; // restore original length
		this->m_p[oldLength] = 0;
		return true;
	}